

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

void __thiscall
BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparseNode<Memory::JitArenaAllocator> *node2)

{
  Type TVar1;
  Type pJVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  bool bVar7;
  
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)this->head;
  this->lastFoundIndex = (Type_conflict)0x0;
  bVar7 = pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0;
  pBVar3 = pBVar5;
  pBVar6 = this;
  if (node2 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0 && bVar7) {
    do {
      pJVar2 = (Type)(node2->data).word;
      pBVar5 = pBVar3;
      if (pJVar2 != (Type)0x0) {
        *(Type *)&pBVar3->lastFoundIndex = node2->startIndex;
        pBVar3->alloc = pJVar2;
        pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)pBVar3->head;
        pBVar6 = pBVar3;
      }
      node2 = node2->next;
      bVar7 = pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0;
    } while ((bVar7) && (pBVar3 = pBVar5, node2 != (Type)0x0));
  }
  if (bVar7) {
    if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar2 = this->alloc;
      pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)pJVar2->bvFreeList;
      do {
        pBVar4 = pBVar5;
        pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
        pBVar4->head = (Type_conflict)pBVar3;
        pBVar3 = pBVar4;
      } while (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0);
      this->lastFoundIndex = (Type_conflict)0x0;
      pJVar2->bvFreeList = (BVSparseNode *)pBVar4;
      this->lastUsedNodePrevNextField = &this->head;
    }
    pBVar6->head = (Type_conflict)0x0;
  }
  else {
    for (; node2 != (Type)0x0; node2 = node2->next) {
      pBVar5 = pBVar6;
      if ((node2->data).word != 0) {
        TVar1 = node2->startIndex;
        pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x18,this->alloc,0x3eba5c);
        pBVar5->head = (Type)0x0;
        *(Type *)&pBVar5->lastFoundIndex = TVar1;
        ((Type *)&pBVar5->alloc)->word = 0;
        ((Type *)&pBVar5->alloc)->word = (node2->data).word;
        pBVar6->head = (Type_conflict)pBVar5;
      }
      pBVar6 = pBVar5;
    }
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::CopyFromNode(const ::BVSparseNode<TSrcAllocator> * node2)
{
    BVSparseNode * node1 = this->head;
    Field(BVSparseNode*, TAllocator)* prevNextField = &this->head;
    this->lastFoundIndex = nullptr;

    while (node1 != nullptr && node2 != nullptr)
    {
        if (!node2->data.IsEmpty())
        {
            node1->startIndex = node2->startIndex;
            node1->data.Copy(node2->data);
            prevNextField = &node1->next;
            node1 = node1->next;
        }

        node2 = node2->next;
    }

    if (node1 != nullptr)
    {
        while (node1 != nullptr)
        {
            node1 = this->DeleteNode(node1);
        }
        *prevNextField = nullptr;
    }
    else
    {
        while (node2 != nullptr)
        {
            if (!node2->data.IsEmpty())
            {
                BVSparseNode * newNode = Allocate(node2->startIndex, nullptr);
                newNode->data.Copy(node2->data);
                *prevNextField = newNode;
                prevNextField = &newNode->next;
            }
            node2 = node2->next;
        }
    }
}